

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_avx2.c
# Opt level: O2

void av1_fwd_txfm2d_16x16_avx2(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  char cVar1;
  int8_t *piVar2;
  undefined7 in_register_00000009;
  int iVar3;
  __m256i out [32];
  __m256i in [32];
  int iVar4;
  longlong local_860 [128];
  longlong local_460 [134];
  
  piVar2 = av1_fwd_txfm_shift_ls[2];
  switch(CONCAT71(in_register_00000009,tx_type) & 0xffffffff) {
  case 0:
    load_buffer_16xn_avx2(input,(__m256i *)local_460,stride,0x10,2,0,0);
    round_shift_32_8xn_avx2((__m256i *)local_460,0x20,(int)*piVar2,1);
    fdct16_avx2((__m256i *)local_460,(__m256i *)local_860,'\r',2,2);
    break;
  case 1:
    load_buffer_16xn_avx2(input,(__m256i *)local_460,stride,0x10,2,0,0);
    round_shift_32_8xn_avx2((__m256i *)local_460,0x20,(int)*piVar2,1);
    fadst16_avx2((__m256i *)local_460,(__m256i *)local_860,'\r',2,2);
    break;
  case 2:
    iVar4 = 0;
    goto LAB_003dff8c;
  case 3:
    iVar4 = 0;
    goto LAB_003dfe98;
  case 4:
    load_buffer_16xn_avx2(input,(__m256i *)local_460,stride,0x10,2,1,0);
    round_shift_32_8xn_avx2((__m256i *)local_460,0x20,(int)*piVar2,1);
    fadst16_avx2((__m256i *)local_460,(__m256i *)local_860,'\r',2,2);
    cVar1 = piVar2[1];
    goto LAB_003dff54;
  case 5:
    iVar4 = 1;
LAB_003dff8c:
    load_buffer_16xn_avx2(input,(__m256i *)local_460,stride,0x10,2,0,iVar4);
    round_shift_32_8xn_avx2((__m256i *)local_460,0x20,(int)*piVar2,1);
    fdct16_avx2((__m256i *)local_460,(__m256i *)local_860,'\r',2,2);
LAB_003e002c:
    cVar1 = piVar2[1];
LAB_003e0137:
    iVar3 = 2;
    round_shift_32_8xn_avx2((__m256i *)local_860,0x20,(int)cVar1,1);
    fwd_txfm_transpose_16x16_avx2((__m256i *)local_860,(__m256i *)local_460);
    fadst16_avx2((__m256i *)local_460,(__m256i *)local_860,'\f',2,2);
    goto LAB_003e0163;
  case 6:
    iVar4 = 1;
    goto LAB_003e00d7;
  case 7:
    iVar4 = 1;
LAB_003dfe98:
    load_buffer_16xn_avx2(input,(__m256i *)local_460,stride,0x10,2,0,iVar4);
    round_shift_32_8xn_avx2((__m256i *)local_460,0x20,(int)*piVar2,1);
    fadst16_avx2((__m256i *)local_460,(__m256i *)local_860,'\r',2,2);
    goto LAB_003e002c;
  case 8:
    iVar4 = 0;
LAB_003e00d7:
    load_buffer_16xn_avx2(input,(__m256i *)local_460,stride,0x10,2,1,iVar4);
    round_shift_32_8xn_avx2((__m256i *)local_460,0x20,(int)*piVar2,1);
    fadst16_avx2((__m256i *)local_460,(__m256i *)local_860,'\r',2,2);
    cVar1 = piVar2[1];
    goto LAB_003e0137;
  case 9:
    iVar4 = 2;
    load_buffer_16xn_avx2(input,(__m256i *)local_460,stride,0x10,2,0,0);
    round_shift_32_8xn_avx2((__m256i *)local_460,0x20,(int)*piVar2,1);
    idtx16_avx2((__m256i *)local_460,(__m256i *)local_860,'\0',2,iVar4);
    round_shift_32_8xn_avx2((__m256i *)local_860,0x20,(int)piVar2[1],1);
    fwd_txfm_transpose_16x16_avx2((__m256i *)local_860,(__m256i *)local_460);
    goto LAB_003e00c9;
  case 10:
    iVar4 = 2;
    load_buffer_16xn_avx2(input,(__m256i *)local_460,stride,0x10,2,0,0);
    round_shift_32_8xn_avx2((__m256i *)local_460,0x20,(int)*piVar2,1);
    fdct16_avx2((__m256i *)local_460,(__m256i *)local_860,'\r',2,2);
    goto LAB_003e00a1;
  case 0xb:
    iVar4 = 2;
    load_buffer_16xn_avx2(input,(__m256i *)local_460,stride,0x10,2,0,0);
    round_shift_32_8xn_avx2((__m256i *)local_460,0x20,(int)*piVar2,1);
    idtx16_avx2((__m256i *)local_460,(__m256i *)local_860,'\0',2,iVar4);
    break;
  case 0xc:
    iVar4 = 2;
    load_buffer_16xn_avx2(input,(__m256i *)local_460,stride,0x10,2,0,0);
    round_shift_32_8xn_avx2((__m256i *)local_460,0x20,(int)*piVar2,1);
    fadst16_avx2((__m256i *)local_460,(__m256i *)local_860,'\r',2,2);
LAB_003e00a1:
    cVar1 = piVar2[1];
LAB_003e00ae:
    round_shift_32_8xn_avx2((__m256i *)local_860,0x20,(int)cVar1,1);
    fwd_txfm_transpose_16x16_avx2((__m256i *)local_860,(__m256i *)local_460);
LAB_003e00c9:
    iVar3 = 2;
    idtx16_avx2((__m256i *)local_460,(__m256i *)local_860,'\0',2,iVar4);
    goto LAB_003e0163;
  case 0xd:
    iVar4 = 0;
    goto LAB_003dffe5;
  case 0xe:
    iVar4 = 2;
    load_buffer_16xn_avx2(input,(__m256i *)local_460,stride,0x10,2,1,0);
    round_shift_32_8xn_avx2((__m256i *)local_460,0x20,(int)*piVar2,1);
    fadst16_avx2((__m256i *)local_460,(__m256i *)local_860,'\r',2,2);
    cVar1 = piVar2[1];
    goto LAB_003e00ae;
  case 0xf:
    iVar4 = 1;
LAB_003dffe5:
    iVar3 = 2;
    load_buffer_16xn_avx2(input,(__m256i *)local_460,stride,0x10,2,0,iVar4);
    round_shift_32_8xn_avx2((__m256i *)local_460,0x20,(int)*piVar2,1);
    idtx16_avx2((__m256i *)local_460,(__m256i *)local_860,'\0',2,iVar3);
    goto LAB_003e002c;
  default:
    goto switchD_003dfc22_default;
  }
  cVar1 = piVar2[1];
LAB_003dff54:
  iVar3 = 2;
  round_shift_32_8xn_avx2((__m256i *)local_860,0x20,(int)cVar1,1);
  fwd_txfm_transpose_16x16_avx2((__m256i *)local_860,(__m256i *)local_460);
  fdct16_avx2((__m256i *)local_460,(__m256i *)local_860,'\f',2,2);
LAB_003e0163:
  store_buffer_avx2((__m256i *)local_860,coeff,0x20,iVar3);
switchD_003dfc22_default:
  return;
}

Assistant:

void av1_fwd_txfm2d_16x16_avx2(const int16_t *input, int32_t *coeff, int stride,
                               TX_TYPE tx_type, int bd) {
  __m256i in[32], out[32];
  const TX_SIZE tx_size = TX_16X16;
  const int8_t *shift = av1_fwd_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int width = tx_size_wide[tx_size];
  const int height = tx_size_high[tx_size];
  const int width_div8 = (width >> 3);
  const int width_div16 = (width >> 4);
  const int size = (height << 1);
  switch (tx_type) {
    case DCT_DCT:
      load_buffer_16xn_avx2(input, in, stride, height, width_div8, 0, 0);
      round_shift_32_8xn_avx2(in, size, shift[0], width_div16);
      fdct16_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                  width_div8);
      round_shift_32_8xn_avx2(out, size, shift[1], width_div16);
      fwd_txfm_transpose_16x16_avx2(out, in);
      fdct16_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                  width_div8);
      store_buffer_avx2(out, coeff, 8, 32);
      break;
    case ADST_DCT:
      load_buffer_16xn_avx2(input, in, stride, height, width_div8, 0, 0);
      round_shift_32_8xn_avx2(in, size, shift[0], width_div16);
      fadst16_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                   width_div8);
      round_shift_32_8xn_avx2(out, size, shift[1], width_div16);
      fwd_txfm_transpose_16x16_avx2(out, in);
      fdct16_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                  width_div8);
      store_buffer_avx2(out, coeff, 8, 32);
      break;
    case DCT_ADST:
      load_buffer_16xn_avx2(input, in, stride, height, width_div8, 0, 0);
      round_shift_32_8xn_avx2(in, size, shift[0], width_div16);
      fdct16_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                  width_div8);
      round_shift_32_8xn_avx2(out, size, shift[1], width_div16);
      fwd_txfm_transpose_16x16_avx2(out, in);
      fadst16_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                   width_div8);
      store_buffer_avx2(out, coeff, 8, 32);
      break;
    case ADST_ADST:
      load_buffer_16xn_avx2(input, in, stride, height, width_div8, 0, 0);
      round_shift_32_8xn_avx2(in, size, shift[0], width_div16);
      fadst16_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                   width_div8);
      round_shift_32_8xn_avx2(out, size, shift[1], width_div16);
      fwd_txfm_transpose_16x16_avx2(out, in);
      fadst16_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                   width_div8);
      store_buffer_avx2(out, coeff, 8, 32);
      break;
    case FLIPADST_DCT:
      load_buffer_16xn_avx2(input, in, stride, height, width_div8, 1, 0);
      round_shift_32_8xn_avx2(in, size, shift[0], width_div16);
      fadst16_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                   width_div8);
      round_shift_32_8xn_avx2(out, size, shift[1], width_div16);
      fwd_txfm_transpose_16x16_avx2(out, in);
      fdct16_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                  width_div8);
      store_buffer_avx2(out, coeff, 8, 32);
      break;
    case DCT_FLIPADST:
      load_buffer_16xn_avx2(input, in, stride, height, width_div8, 0, 1);
      round_shift_32_8xn_avx2(in, size, shift[0], width_div16);
      fdct16_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                  width_div8);
      round_shift_32_8xn_avx2(out, size, shift[1], width_div16);
      fwd_txfm_transpose_16x16_avx2(out, in);
      fadst16_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                   width_div8);
      store_buffer_avx2(out, coeff, 8, 32);
      break;
    case FLIPADST_FLIPADST:
      load_buffer_16xn_avx2(input, in, stride, height, width_div8, 1, 1);
      round_shift_32_8xn_avx2(in, size, shift[0], width_div16);
      fadst16_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                   width_div8);
      round_shift_32_8xn_avx2(out, size, shift[1], width_div16);
      fwd_txfm_transpose_16x16_avx2(out, in);
      fadst16_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                   width_div8);
      store_buffer_avx2(out, coeff, 8, 32);
      break;
    case ADST_FLIPADST:
      load_buffer_16xn_avx2(input, in, stride, height, width_div8, 0, 1);
      round_shift_32_8xn_avx2(in, size, shift[0], width_div16);
      fadst16_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                   width_div8);
      round_shift_32_8xn_avx2(out, size, shift[1], width_div16);
      fwd_txfm_transpose_16x16_avx2(out, in);
      fadst16_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                   width_div8);
      store_buffer_avx2(out, coeff, 8, 32);
      break;
    case FLIPADST_ADST:
      load_buffer_16xn_avx2(input, in, stride, height, width_div8, 1, 0);
      round_shift_32_8xn_avx2(in, size, shift[0], width_div16);
      fadst16_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                   width_div8);
      round_shift_32_8xn_avx2(out, size, shift[1], width_div16);
      fwd_txfm_transpose_16x16_avx2(out, in);
      fadst16_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                   width_div8);
      store_buffer_avx2(out, coeff, 8, 32);
      break;
    case IDTX:
      load_buffer_16xn_avx2(input, in, stride, height, width_div8, 0, 0);
      round_shift_32_8xn_avx2(in, size, shift[0], width_div16);
      idtx16_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                  width_div8);
      round_shift_32_8xn_avx2(out, size, shift[1], width_div16);
      fwd_txfm_transpose_16x16_avx2(out, in);
      idtx16_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                  width_div8);
      store_buffer_avx2(out, coeff, 8, 32);
      break;
    case V_DCT:
      load_buffer_16xn_avx2(input, in, stride, height, width_div8, 0, 0);
      round_shift_32_8xn_avx2(in, size, shift[0], width_div16);
      fdct16_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                  width_div8);
      round_shift_32_8xn_avx2(out, size, shift[1], width_div16);
      fwd_txfm_transpose_16x16_avx2(out, in);
      idtx16_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                  width_div8);
      store_buffer_avx2(out, coeff, 8, 32);
      break;
    case H_DCT:
      load_buffer_16xn_avx2(input, in, stride, height, width_div8, 0, 0);
      round_shift_32_8xn_avx2(in, size, shift[0], width_div16);
      idtx16_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                  width_div8);
      round_shift_32_8xn_avx2(out, size, shift[1], width_div16);
      fwd_txfm_transpose_16x16_avx2(out, in);
      fdct16_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                  width_div8);
      store_buffer_avx2(out, coeff, 8, 32);
      break;
    case V_ADST:
      load_buffer_16xn_avx2(input, in, stride, height, width_div8, 0, 0);
      round_shift_32_8xn_avx2(in, size, shift[0], width_div16);
      fadst16_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                   width_div8);
      round_shift_32_8xn_avx2(out, size, shift[1], width_div16);
      fwd_txfm_transpose_16x16_avx2(out, in);
      idtx16_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                  width_div8);
      store_buffer_avx2(out, coeff, 8, 32);
      break;
    case H_ADST:
      load_buffer_16xn_avx2(input, in, stride, height, width_div8, 0, 0);
      round_shift_32_8xn_avx2(in, size, shift[0], width_div16);
      idtx16_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                  width_div8);
      round_shift_32_8xn_avx2(out, size, shift[1], width_div16);
      fwd_txfm_transpose_16x16_avx2(out, in);
      fadst16_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                   width_div8);
      store_buffer_avx2(out, coeff, 8, 32);
      break;
    case V_FLIPADST:
      load_buffer_16xn_avx2(input, in, stride, height, width_div8, 1, 0);
      round_shift_32_8xn_avx2(in, size, shift[0], width_div16);
      fadst16_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                   width_div8);
      round_shift_32_8xn_avx2(out, size, shift[1], width_div16);
      fwd_txfm_transpose_16x16_avx2(out, in);
      idtx16_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                  width_div8);
      store_buffer_avx2(out, coeff, 8, 32);
      break;
    case H_FLIPADST:
      load_buffer_16xn_avx2(input, in, stride, height, width_div8, 0, 1);
      round_shift_32_8xn_avx2(in, size, shift[0], width_div16);
      idtx16_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                  width_div8);
      round_shift_32_8xn_avx2(out, size, shift[1], width_div16);
      fwd_txfm_transpose_16x16_avx2(out, in);
      fadst16_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                   width_div8);
      store_buffer_avx2(out, coeff, 8, 32);
      break;
    default: assert(0);
  }
  (void)bd;
}